

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_exceptions.hpp
# Opt level: O2

void __thiscall CompoundFile::Exception::Exception(Exception *this,wstring *what)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,"Use whatAsWString() method.");
  *(undefined ***)this = &PTR__Exception_00125870;
  std::__cxx11::wstring::wstring((wstring *)&this->m_what,(wstring *)what);
  return;
}

Assistant:

inline
Exception::Exception( const std::wstring & what )
	:	std::runtime_error( "Use whatAsWString() method." )
	,	m_what( what )
{
}